

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile_exceptions.hpp
# Opt level: O1

void __thiscall CompoundFile::Exception::~Exception(Exception *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  pointer pwVar2;
  
  *(undefined ***)this = &PTR__Exception_0010fbe0;
  pwVar2 = (this->m_what)._M_dataplus._M_p;
  paVar1 = &(this->m_what).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)pwVar2 != paVar1) {
    operator_delete(pwVar2,paVar1->_M_allocated_capacity * 4 + 4);
  }
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

inline
Exception::~Exception() noexcept
{
}